

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersector1<8,_1,_false,_embree::avx2::ArrayIntersector1<embree::avx2::ObjectIntersector1<false>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  RTCIntersectFunctionN p_Var14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  undefined4 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  int mask;
  NodeRef stack [564];
  ulong *local_1358;
  int local_134c;
  ulong local_1348;
  RayQueryContext *local_1340;
  Ray *local_1338;
  long local_1330;
  long local_1328;
  RTCIntersectFunctionNArguments local_1320;
  Geometry *local_12f0;
  undefined8 local_12e8;
  RTCIntersectArguments *local_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8 [565];
  uint uVar24;
  
  local_11d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      auVar3 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar22._8_4_ = 0x7fffffff;
      auVar22._0_8_ = 0x7fffffff7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx((undefined1  [16])aVar2,auVar22);
      auVar26._8_4_ = 0x219392ef;
      auVar26._0_8_ = 0x219392ef219392ef;
      auVar26._12_4_ = 0x219392ef;
      auVar22 = vcmpps_avx(auVar22,auVar26,1);
      auVar22 = vblendvps_avx((undefined1  [16])aVar2,auVar26,auVar22);
      local_1358 = local_11d8 + 1;
      auVar26 = vrcpps_avx(auVar22);
      auVar27._8_4_ = 0x3f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._12_4_ = 0x3f800000;
      auVar22 = vfnmadd231ps_fma(auVar27,auVar26,auVar22);
      auVar8 = vfmadd132ps_fma(auVar22,auVar26,auVar26);
      fVar25 = auVar8._0_4_;
      local_11f8._4_4_ = fVar25;
      local_11f8._0_4_ = fVar25;
      local_11f8._8_4_ = fVar25;
      local_11f8._12_4_ = fVar25;
      local_11f8._16_4_ = fVar25;
      local_11f8._20_4_ = fVar25;
      local_11f8._24_4_ = fVar25;
      local_11f8._28_4_ = fVar25;
      auVar33 = ZEXT3264(local_11f8);
      auVar22 = vmovshdup_avx(auVar8);
      uVar21 = auVar22._0_8_;
      local_1218._8_8_ = uVar21;
      local_1218._0_8_ = uVar21;
      local_1218._16_8_ = uVar21;
      local_1218._24_8_ = uVar21;
      auVar34 = ZEXT3264(local_1218);
      auVar27 = vshufpd_avx(auVar8,auVar8,1);
      auVar26 = vshufps_avx(auVar8,auVar8,0xaa);
      uVar21 = auVar26._0_8_;
      local_1238._8_8_ = uVar21;
      local_1238._0_8_ = uVar21;
      local_1238._16_8_ = uVar21;
      local_1238._24_8_ = uVar21;
      auVar35 = ZEXT3264(local_1238);
      auVar28._0_4_ = fVar25 * (ray->org).field_0.m128[0];
      auVar28._4_4_ = auVar8._4_4_ * (ray->org).field_0.m128[1];
      auVar28._8_4_ = auVar8._8_4_ * (ray->org).field_0.m128[2];
      auVar28._12_4_ = auVar8._12_4_ * (ray->org).field_0.m128[3];
      auVar26 = vmovshdup_avx(auVar28);
      auVar8 = vshufps_avx(auVar28,auVar28,0xaa);
      uVar17 = (ulong)(fVar25 < 0.0) << 5;
      uVar19 = (ulong)(auVar22._0_4_ < 0.0) << 5 | 0x40;
      uVar15 = (ulong)(auVar27._0_4_ < 0.0) << 5 | 0x80;
      uVar18 = uVar17 ^ 0x20;
      uVar16 = CONCAT44(auVar28._0_4_,auVar28._0_4_);
      local_1258._0_8_ = uVar16 ^ 0x8000000080000000;
      local_1258._8_4_ = -auVar28._0_4_;
      local_1258._12_4_ = -auVar28._0_4_;
      local_1258._16_4_ = -auVar28._0_4_;
      local_1258._20_4_ = -auVar28._0_4_;
      local_1258._24_4_ = -auVar28._0_4_;
      local_1258._28_4_ = -auVar28._0_4_;
      auVar31 = ZEXT3264(local_1258);
      uVar12 = auVar26._0_4_;
      uVar24 = auVar26._4_4_;
      local_1278._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
      local_1278._8_4_ = uVar12 ^ 0x80000000;
      local_1278._12_4_ = uVar24 ^ 0x80000000;
      local_1278._16_4_ = uVar12 ^ 0x80000000;
      local_1278._20_4_ = uVar24 ^ 0x80000000;
      local_1278._24_4_ = uVar12 ^ 0x80000000;
      local_1278._28_4_ = uVar24 ^ 0x80000000;
      auVar23 = ZEXT3264(local_1278);
      uVar12 = auVar8._0_4_;
      uVar24 = auVar8._4_4_;
      local_1298._0_8_ = auVar8._0_8_ ^ 0x8000000080000000;
      local_1298._8_4_ = uVar12 ^ 0x80000000;
      local_1298._12_4_ = uVar24 ^ 0x80000000;
      local_1298._16_4_ = uVar12 ^ 0x80000000;
      local_1298._20_4_ = uVar24 ^ 0x80000000;
      local_1298._24_4_ = uVar12 ^ 0x80000000;
      local_1298._28_4_ = uVar24 ^ 0x80000000;
      auVar29 = ZEXT3264(local_1298);
      uVar20 = auVar3._0_4_;
      local_12b8._4_4_ = uVar20;
      local_12b8._0_4_ = uVar20;
      local_12b8._8_4_ = uVar20;
      local_12b8._12_4_ = uVar20;
      local_12b8._16_4_ = uVar20;
      local_12b8._20_4_ = uVar20;
      local_12b8._24_4_ = uVar20;
      local_12b8._28_4_ = uVar20;
      auVar30 = ZEXT3264(local_12b8);
      local_12d8._4_4_ = fVar1;
      local_12d8._0_4_ = fVar1;
      local_12d8._8_4_ = fVar1;
      local_12d8._12_4_ = fVar1;
      local_12d8._16_4_ = fVar1;
      local_12d8._20_4_ = fVar1;
      local_12d8._24_4_ = fVar1;
      local_12d8._28_4_ = fVar1;
      auVar32 = ZEXT3264(local_12d8);
      local_1348 = uVar17;
      local_1340 = context;
      local_1338 = ray;
LAB_0153183b:
      if (local_1358 != local_11d8) {
        uVar16 = local_1358[-1];
        local_1358 = local_1358 + -1;
        while ((uVar16 & 8) == 0) {
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar17),auVar31._0_32_,
                                    auVar33._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar19),auVar23._0_32_,
                                   auVar34._0_32_);
          auVar4 = vpmaxsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar3));
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar15),auVar29._0_32_,
                                    auVar35._0_32_);
          auVar5 = vpmaxsd_avx2(ZEXT1632(auVar22),auVar30._0_32_);
          auVar4 = vpmaxsd_avx2(auVar4,auVar5);
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar18),auVar31._0_32_,
                                    auVar33._0_32_);
          auVar3 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar19 ^ 0x20)),
                                   auVar23._0_32_,auVar34._0_32_);
          auVar5 = vpminsd_avx2(ZEXT1632(auVar22),ZEXT1632(auVar3));
          auVar22 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar15 ^ 0x20)),
                                    auVar29._0_32_,auVar35._0_32_);
          auVar6 = vpminsd_avx2(ZEXT1632(auVar22),auVar32._0_32_);
          auVar5 = vpminsd_avx2(auVar5,auVar6);
          auVar4 = vpcmpgtd_avx2(auVar4,auVar5);
          iVar10 = vmovmskps_avx(auVar4);
          if (iVar10 == 0xff) goto LAB_0153183b;
          bVar9 = ~(byte)iVar10;
          uVar11 = uVar16 & 0xfffffffffffffff0;
          lVar7 = 0;
          for (uVar16 = (ulong)bVar9; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
          {
            lVar7 = lVar7 + 1;
          }
          uVar16 = *(ulong *)(uVar11 + lVar7 * 8);
          uVar12 = bVar9 - 1 & (uint)bVar9;
          uVar13 = (ulong)uVar12;
          if (uVar12 != 0) {
            do {
              *local_1358 = uVar16;
              local_1358 = local_1358 + 1;
              lVar7 = 0;
              for (uVar16 = uVar13; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                lVar7 = lVar7 + 1;
              }
              uVar13 = uVar13 - 1 & uVar13;
              uVar16 = *(ulong *)(uVar11 + lVar7 * 8);
            } while (uVar13 != 0);
          }
        }
        local_1330 = (ulong)((uint)uVar16 & 0xf) - 8;
        for (local_1328 = 0; local_1330 != local_1328; local_1328 = local_1328 + 1) {
          local_1320.geomID = *(uint *)((uVar16 & 0xfffffffffffffff0) + local_1328 * 8);
          local_12f0 = (context->scene->geometries).items[local_1320.geomID].ptr;
          if ((ray->mask & local_12f0->mask) != 0) {
            local_1320.primID = *(uint *)((uVar16 & 0xfffffffffffffff0) + 4 + local_1328 * 8);
            local_134c = -1;
            local_1320.valid = &local_134c;
            local_1320.geometryUserPtr = local_12f0->userPtr;
            local_1320.context = context->user;
            local_1320.N = 1;
            local_12e8 = 0;
            local_12e0 = context->args;
            p_Var14 = local_12e0->intersect;
            if (p_Var14 == (RTCIntersectFunctionN)0x0) {
              p_Var14 = (RTCIntersectFunctionN)
                        local_12f0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                        _M_i;
            }
            local_1320.rayhit = (RTCRayHitN *)ray;
            (*p_Var14)(&local_1320);
            auVar33 = ZEXT3264(local_11f8);
            auVar34 = ZEXT3264(local_1218);
            auVar35 = ZEXT3264(local_1238);
            auVar31 = ZEXT3264(local_1258);
            auVar23 = ZEXT3264(local_1278);
            auVar29 = ZEXT3264(local_1298);
            auVar30 = ZEXT3264(local_12b8);
            auVar32 = ZEXT3264(local_12d8);
            context = local_1340;
            ray = local_1338;
            uVar17 = local_1348;
            if (local_1338->tfar < 0.0) {
              local_1338->tfar = -INFINITY;
              return;
            }
          }
        }
        goto LAB_0153183b;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }